

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O1

void Gia_ManCreateGate(Gia_Man_t *pNew,Gia_Obj_t *pObj,Vec_Int_t *vSuper)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  
  iVar9 = vSuper->nSize;
  if (0 < iVar9) {
    vSuper->nSize = iVar9 - 1U;
    if (iVar9 != 1) {
      iVar7 = vSuper->pArray[iVar9 - 1U];
      vSuper->nSize = iVar9 - 2U;
      iVar9 = vSuper->pArray[iVar9 - 2U];
      uVar6 = (uint)*(undefined8 *)pObj;
      if (((~uVar6 & 0x1fffffff) == 0 || (int)uVar6 < 0) ||
         (((uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff) <= (uVar6 & 0x1fffffff))) {
        uVar6 = Gia_ManHashAnd(pNew,iVar7,iVar9);
      }
      else if (pNew->pMuxes == (uint *)0x0) {
        uVar6 = Gia_ManHashXor(pNew,iVar7,iVar9);
      }
      else {
        uVar6 = Gia_ManHashXorReal(pNew,iVar7,iVar9);
      }
      Vec_IntPush(vSuper,uVar6);
      if (-1 < (int)uVar6) {
        if (pNew->nObjs <= (int)(uVar6 >> 1)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        Gia_ObjSetGateLevel(pNew,pNew->pObjs + (uVar6 >> 1));
        uVar10 = (ulong)(uint)vSuper->nSize;
        do {
          iVar9 = (int)uVar10;
          if (iVar9 < 2) {
            return;
          }
          if (vSuper->nSize < iVar9) {
LAB_006fe9bf:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar7 = (int)(uVar10 - 2);
          if (vSuper->nSize <= iVar7) goto LAB_006fe9bf;
          uVar6 = vSuper->pArray[uVar10 - 1];
          if ((int)uVar6 < 0) break;
          uVar8 = uVar10 - 2 & 0xffffffff;
          uVar1 = vSuper->pArray[uVar8];
          uVar11 = uVar6 >> 1;
          pVVar4 = pNew->vLevels;
          Vec_IntFillExtra(pVVar4,uVar11 + 1,0);
          if (pVVar4->nSize <= (int)uVar11) goto LAB_006fe9bf;
          if ((int)uVar1 < 0) break;
          iVar2 = pVVar4->pArray[uVar11];
          uVar11 = uVar1 >> 1;
          pVVar4 = pNew->vLevels;
          Vec_IntFillExtra(pVVar4,uVar11 + 1,0);
          if (pVVar4->nSize <= (int)uVar11) goto LAB_006fe9bf;
          iVar3 = pVVar4->pArray[uVar11];
          if (iVar2 <= iVar3) {
            return;
          }
          if (vSuper->nSize < iVar9) {
LAB_006fe9fd:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          piVar5 = vSuper->pArray;
          piVar5[uVar10 - 1] = uVar1;
          if (vSuper->nSize <= iVar7) goto LAB_006fe9fd;
          uVar10 = uVar10 - 1;
          piVar5[uVar8] = uVar6;
          if (iVar2 <= iVar3) {
            return;
          }
        } while( true );
      }
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
  }
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
}

Assistant:

void Gia_ManCreateGate( Gia_Man_t * pNew, Gia_Obj_t * pObj, Vec_Int_t * vSuper )
{
    int iLit0 = Vec_IntPop(vSuper);
    int iLit1 = Vec_IntPop(vSuper);
//    int iLit1 = Gia_ManFindSharedNode(pNew, vSuper, iLit0);
    int iLit, i;
    if ( !Gia_ObjIsXor(pObj) )
        iLit = Gia_ManHashAnd( pNew, iLit0, iLit1 );
    else if ( pNew->pMuxes )
        iLit = Gia_ManHashXorReal( pNew, iLit0, iLit1 );
    else 
        iLit = Gia_ManHashXor( pNew, iLit0, iLit1 );
    Vec_IntPush( vSuper, iLit );
    Gia_ObjSetGateLevel( pNew, Gia_ManObj(pNew, Abc_Lit2Var(iLit)) );
    // shift to the corrent location
    for ( i = Vec_IntSize(vSuper)-1; i > 0; i-- )
    {
        int iLit1 = Vec_IntEntry(vSuper, i);
        int iLit2 = Vec_IntEntry(vSuper, i-1);
        if ( Gia_ObjLevelId(pNew, Abc_Lit2Var(iLit1)) <= Gia_ObjLevelId(pNew, Abc_Lit2Var(iLit2)) )
            break;
        Vec_IntWriteEntry( vSuper, i,   iLit2 );
        Vec_IntWriteEntry( vSuper, i-1, iLit1 );
    }
}